

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtmidi_c.cpp
# Opt level: O0

char * rtmidi_get_port_name(RtMidiPtr device,uint portNumber)

{
  char *pcVar1;
  RtMidiError *err;
  string local_40 [8];
  string name;
  uint portNumber_local;
  RtMidiPtr device_local;
  
  name.field_2._12_4_ = portNumber;
  (**(code **)(*device->ptr + 0x18))(local_40,device->ptr,portNumber);
  pcVar1 = (char *)std::__cxx11::string::c_str();
  pcVar1 = strdup(pcVar1);
  std::__cxx11::string::~string(local_40);
  return pcVar1;
}

Assistant:

const char* rtmidi_get_port_name (RtMidiPtr device, unsigned int portNumber)
{
    try {
        std::string name = ((RtMidi*) device->ptr)->getPortName (portNumber);
        return strdup (name.c_str ());

    } catch (const RtMidiError & err) {
        device->ok  = false;
        device->msg = err.what ();
        return "";
    }
}